

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# suffix_array.hpp
# Opt level: O2

void __thiscall
suffix_array<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_unsigned_int,_false>
::shift_buckets(suffix_array<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_unsigned_int,_false>
                *this,size_t dist,vector<unsigned_int,_std::allocator<unsigned_int>_> *param_2)

{
  block_decomposition_buffered<unsigned_int> *this_00;
  uint uVar1;
  size_type __new_size;
  pointer puVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  pointer puVar6;
  size_t i;
  ulong uVar7;
  size_t sVar8;
  ulong uVar9;
  uint uVar10;
  ulong uVar11;
  ulong uVar12;
  size_t sVar13;
  datatype mxxindex_t;
  MPI_Request recv_reqs [2];
  
  __new_size = this->local_size;
  if (__new_size !=
      (long)(this->local_B).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)(this->local_B).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start >> 2) {
    __assert_fail("local_size == local_B.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/include/suffix_array.hpp"
                  ,0x264,
                  "void suffix_array<__gnu_cxx::__normal_iterator<char *, std::basic_string<char>>, unsigned int>::shift_buckets(std::size_t, std::vector<index_t> &) [InputIterator = __gnu_cxx::__normal_iterator<char *, std::basic_string<char>>, index_t = unsigned int, _CONSTRUCT_LCP = false]"
                 );
  }
  uVar1 = (this->part).prefix;
  uVar11 = (ulong)uVar1;
  puVar2 = (param_2->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  puVar6 = (param_2->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if ((long)puVar6 - (long)puVar2 >> 2 != __new_size) {
    if (puVar6 != puVar2) {
      (param_2->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_finish = puVar2;
    }
    mxxindex_t._vptr_datatype =
         (_func_int **)((ulong)mxxindex_t._vptr_datatype & 0xffffffff00000000);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
              (param_2,__new_size,(value_type_conflict3 *)&mxxindex_t);
  }
  this_00 = &this->part;
  mxxindex_t._vptr_datatype = (_func_int **)&PTR__datatype_001b4f50;
  mxxindex_t.mpitype = (MPI_Datatype)&ompi_mpi_unsigned;
  mxxindex_t.builtin = true;
  uVar12 = uVar11 + dist;
  uVar9 = 0;
  if (uVar12 < this->n) {
    iVar3 = mxx::partition::block_decomposition_buffered<unsigned_int>::target_processor
                      (this_00,(uint)uVar12);
    uVar5 = iVar3 + 1;
    uVar10 = (this->part).mod;
    if (uVar5 < uVar10) {
      uVar10 = uVar5;
    }
    uVar12 = (uVar10 + (this->part).div * uVar5) - uVar12;
    uVar9 = 0;
    if (iVar3 != (this->comm).m_rank) {
      if (0x7ffffffe < uVar12) {
        __assert_fail("p1_recv_cnt < std::numeric_limits<int>::max()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/include/suffix_array.hpp"
                      ,0x27c,
                      "void suffix_array<__gnu_cxx::__normal_iterator<char *, std::basic_string<char>>, unsigned int>::shift_buckets(std::size_t, std::vector<index_t> &) [InputIterator = __gnu_cxx::__normal_iterator<char *, std::basic_string<char>>, index_t = unsigned int, _CONSTRUCT_LCP = false]"
                     );
      }
      MPI_Irecv((param_2->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                super__Vector_impl_data._M_start,uVar12 & 0xffffffff,&ompi_mpi_unsigned,iVar3,2,
                (this->comm).mpi_comm,recv_reqs);
      uVar9 = 1;
    }
    uVar7 = this->local_size - uVar12;
    if ((uVar12 <= this->local_size && uVar7 != 0) && (iVar3 != this->p + -1)) {
      if (0x7ffffffe < uVar7) {
        __assert_fail("p2_recv_cnt < std::numeric_limits<int>::max()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/include/suffix_array.hpp"
                      ,0x28a,
                      "void suffix_array<__gnu_cxx::__normal_iterator<char *, std::basic_string<char>>, unsigned int>::shift_buckets(std::size_t, std::vector<index_t> &) [InputIterator = __gnu_cxx::__normal_iterator<char *, std::basic_string<char>>, index_t = unsigned int, _CONSTRUCT_LCP = false]"
                     );
      }
      MPI_Irecv((param_2->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                super__Vector_impl_data._M_start + uVar12,uVar7,&ompi_mpi_unsigned,uVar5,2,
                (this->comm).mpi_comm,recv_reqs + uVar9);
      uVar9 = (ulong)((int)uVar9 + 1);
    }
  }
  sVar8 = this->local_size;
  if (dist <= (uVar11 + sVar8) - 1) {
    sVar13 = dist - uVar11;
    if (dist < uVar11 || sVar13 == 0) {
      iVar3 = mxx::partition::block_decomposition_buffered<unsigned_int>::target_processor
                        (this_00,uVar1 - (uint)dist);
      sVar8 = this->local_size;
    }
    else {
      iVar3 = -1;
    }
    iVar4 = mxx::partition::block_decomposition_buffered<unsigned_int>::target_processor
                      (this_00,(int)sVar8 + ~(uint)dist + uVar1);
    if (iVar3 == iVar4) {
      sVar13 = 0;
    }
    else if (-1 < iVar3) {
      if (iVar3 == (this->comm).m_rank) {
        __assert_fail("p1 != comm.rank()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/include/suffix_array.hpp"
                      ,0x2a2,
                      "void suffix_array<__gnu_cxx::__normal_iterator<char *, std::basic_string<char>>, unsigned int>::shift_buckets(std::size_t, std::vector<index_t> &) [InputIterator = __gnu_cxx::__normal_iterator<char *, std::basic_string<char>>, index_t = unsigned int, _CONSTRUCT_LCP = false]"
                     );
      }
      uVar5 = iVar3 + 1;
      uVar1 = (this->part).mod;
      if (uVar5 < uVar1) {
        uVar1 = uVar5;
      }
      sVar13 = (dist - uVar11) + (ulong)(uVar5 * (this->part).div + uVar1);
      MPI_Send((this->local_B).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_start,sVar13 & 0xffffffff,&ompi_mpi_unsigned,iVar3
               ,2,(this->comm).mpi_comm);
    }
    if (iVar4 == (this->comm).m_rank) {
      if (sVar13 != dist) {
        __assert_fail("local_split == dist",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/include/suffix_array.hpp"
                      ,0x2b3,
                      "void suffix_array<__gnu_cxx::__normal_iterator<char *, std::basic_string<char>>, unsigned int>::shift_buckets(std::size_t, std::vector<index_t> &) [InputIterator = __gnu_cxx::__normal_iterator<char *, std::basic_string<char>>, index_t = unsigned int, _CONSTRUCT_LCP = false]"
                     );
      }
      uVar11 = this->local_size;
      puVar2 = (this->local_B).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_start;
      puVar6 = (param_2->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
               super__Vector_impl_data._M_start;
      for (; dist < uVar11; dist = dist + 1) {
        *puVar6 = puVar2[dist];
        puVar6 = puVar6 + 1;
      }
    }
    else {
      MPI_Send((this->local_B).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_start + sVar13,(int)this->local_size - (int)sVar13
               ,&ompi_mpi_unsigned,iVar4,2,(this->comm).mpi_comm);
    }
  }
  MPI_Waitall(uVar9,recv_reqs,0);
  mxx::datatype::~datatype(&mxxindex_t);
  return;
}

Assistant:

void shift_buckets(std::size_t dist, std::vector<index_t>& local_B2) {
    // get # elements to the left
    std::size_t prev_size = part.excl_prefix_size();
    assert(local_size == local_B.size());

    // init B2
    if (local_B2.size() != local_size){
        local_B2.clear();
        local_B2.resize(local_size, 0);
    }

    mxx::datatype mxxindex_t = mxx::get_datatype<index_t>();
    MPI_Datatype mpi_index_t = mxxindex_t.type();

    MPI_Request recv_reqs[2];
    int n_irecvs = 0;
    // receive elements from the right
    if (prev_size + dist < n) {
        std::size_t right_first_gl_idx = prev_size + dist;
        int p1 = part.target_processor(right_first_gl_idx);

        std::size_t p1_gl_end = part.prefix_size(p1);
        std::size_t p1_recv_cnt = p1_gl_end - right_first_gl_idx;

        if (p1 != comm.rank()) {
            // only receive if the source is not myself (i.e., `rank`)
            // [otherwise results are directly written instead of MPI_Sended]
            assert(p1_recv_cnt < std::numeric_limits<int>::max());
            int recv_cnt = p1_recv_cnt;
            MPI_Irecv(&local_B2[0],recv_cnt, mpi_index_t, p1,
                      PSAC_TAG_SHIFT, comm, &recv_reqs[n_irecvs++]);
        }

        if (p1_recv_cnt < local_size && p1 != p-1) {
            // also receive from one more processor
            int p2 = p1+1;
            // since p2 has at least local_size - 1 elements and at least
            // one element came from p1, we can assume that the receive count
            // is our local size minus the already received elements
            std::size_t p2_recv_cnt = local_size - p1_recv_cnt;

            assert(p2_recv_cnt < std::numeric_limits<int>::max());
            int recv_cnt = p2_recv_cnt;
            // send to `p1` (which is necessarily different from `rank`)
            MPI_Irecv(&local_B2[0] + p1_recv_cnt, recv_cnt, mpi_index_t, p2,
                      PSAC_TAG_SHIFT, comm, &recv_reqs[n_irecvs++]);
        }
    }

    // send elements to the left (split to at most 2 target processors)
    if (prev_size + local_size - 1 >= dist) {
        int p1 = -1;
        if (prev_size >= dist) {
            std::size_t first_gl_idx = prev_size - dist;
            p1 = part.target_processor(first_gl_idx);
        }
        std::size_t last_gl_idx = prev_size + local_size - 1 - dist;
        int p2 = part.target_processor(last_gl_idx);

        std::size_t local_split;
        if (p1 != p2) {
            // local start index of area for second processor
            if (p1 >= 0) {
                local_split = part.prefix_size(p1) + dist - prev_size;
                // send to first processor
                assert(p1 != comm.rank());
                MPI_Send(&local_B[0], local_split,
                         mpi_index_t, p1, PSAC_TAG_SHIFT, comm);
            } else {
                // p1 doesn't exist, then there is no prefix to add
                local_split = dist - prev_size;
            }
        } else {
            // only one target processor
            local_split = 0;
        }

        if (p2 != comm.rank()) {
            MPI_Send(&local_B[0] + local_split, local_size - local_split,
                     mpi_index_t, p2, PSAC_TAG_SHIFT, comm);
        } else {
            // in this case the split should be exactly at `dist`
            assert(local_split == dist);
            // locally reassign
            for (std::size_t i = local_split; i < local_size; ++i) {
                local_B2[i-local_split] = local_B[i];
            }
        }
    }

    // wait for successful receive:
    MPI_Waitall(n_irecvs, recv_reqs, MPI_STATUS_IGNORE);
}